

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrSignature *
cfd::core::SignCommon
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          secp256k1_nonce_function_hardened *nonce_fn,ByteData *ndata)

{
  int iVar1;
  secp256k1_context_struct *ctx_00;
  uchar *puVar2;
  undefined8 uVar3;
  uchar *msg32;
  uchar *aux_rand32;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  size_type in_stack_fffffffffffffd98;
  CfdError CVar4;
  secp256k1_context *ctx_01;
  CfdException *in_stack_fffffffffffffda0;
  secp256k1_nonce_function_hardened local_230;
  ByteData local_1e8;
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  undefined1 local_190 [8];
  secp256k1_schnorrsig_extraparams extra_params;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  undefined1 local_128 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_sig;
  secp256k1_nonce_function_hardened nfn;
  string local_100 [48];
  ByteData local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  int local_9c;
  undefined1 local_98 [4];
  int ret;
  secp256k1_keypair keypair;
  secp256k1_context_struct *ctx;
  ByteData *ndata_local;
  secp256k1_nonce_function_hardened *nonce_fn_local;
  Privkey *sk_local;
  ByteData256 *msg_local;
  
  ctx_00 = wally_get_secp_context();
  keypair.data._88_8_ = ctx_00;
  Privkey::GetData(&local_d0,sk);
  ByteData::GetBytes(&local_b8,&local_d0);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b7643);
  iVar1 = secp256k1_keypair_create(ctx_00,(secp256k1_keypair *)local_98,puVar2);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  ByteData::~ByteData((ByteData *)0x4b7679);
  local_9c = iVar1;
  if (iVar1 != 1) {
    nfn._6_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    CVar4 = (CfdError)(in_stack_fffffffffffffd98 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_100,"Could not create keypair.",(allocator *)((long)&nfn + 7));
    CfdException::CfdException
              (in_stack_fffffffffffffda0,CVar4,
               (string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    nfn._6_1_ = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (nonce_fn == (secp256k1_nonce_function_hardened *)0x0) {
    local_230 = (secp256k1_nonce_function_hardened)0x0;
  }
  else {
    local_230 = *nonce_fn;
  }
  raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_230;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4b77f7);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  CVar4 = (CfdError)(in_stack_fffffffffffffd98 >> 0x20);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4b781d);
  uVar3 = keypair.data._88_8_;
  if (raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b7842);
    ByteData256::GetBytes(&local_148,msg);
    msg32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b7867);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,ndata);
    aux_rand32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b788f);
    local_9c = secp256k1_schnorrsig_sign32
                         ((secp256k1_context *)uVar3,puVar2,msg32,(secp256k1_keypair *)local_98,
                          aux_rand32);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  else {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&extra_params.ndata,
                       ndata);
    local_190[0] = 0xda;
    local_190[1] = 'o';
    local_190[2] = 0xb3;
    local_190[3] = 0x8c;
    extra_params._0_8_ =
         raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    extra_params.noncefp =
         (secp256k1_nonce_function_hardened)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b79ac);
    ctx_01 = (secp256k1_context *)keypair.data._88_8_;
    in_stack_fffffffffffffda0 =
         (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b79ca);
    ByteData256::GetBytes(&local_1a8,msg);
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b79ef);
    in_stack_fffffffffffffd94 =
         secp256k1_schnorrsig_sign_custom
                   (ctx_01,(uchar *)in_stack_fffffffffffffda0,puVar2,0x20,
                    (secp256k1_keypair *)local_98,(secp256k1_schnorrsig_extraparams *)local_190);
    CVar4 = (CfdError)((ulong)ctx_01 >> 0x20);
    local_9c = in_stack_fffffffffffffd94;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  if (local_9c != 1) {
    local_1ca = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1c8,"Could not create Schnorr signature.",&local_1c9);
    CfdException::CfdException
              (in_stack_fffffffffffffda0,CVar4,
               (string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    local_1ca = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_1e8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
  SchnorrSignature::SchnorrSignature(__return_storage_ptr__,&local_1e8);
  ByteData::~ByteData((ByteData *)0x4b7baa);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SignCommon(
    const ByteData256 &msg, const Privkey &sk,
    const secp256k1_nonce_function_hardened *nonce_fn, const ByteData ndata) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret =
      secp256k1_keypair_create(ctx, &keypair, sk.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create keypair.");
  }

  secp256k1_nonce_function_hardened nfn =
      nonce_fn == nullptr ? nullptr : *nonce_fn;

  std::vector<uint8_t> raw_sig(SchnorrSignature::kSchnorrSignatureSize);

  if (nfn == nullptr) {
    ret = secp256k1_schnorrsig_sign32(
        ctx, raw_sig.data(), msg.GetBytes().data(), &keypair,
        ndata.GetBytes().data());
  } else {
    std::vector<uint8_t> data = ndata.GetBytes();
    secp256k1_schnorrsig_extraparams extra_params = {
        SECP256K1_SCHNORRSIG_EXTRAPARAMS_MAGIC,
        nfn,
        data.data(),
    };
    ret = secp256k1_schnorrsig_sign_custom(
        ctx, raw_sig.data(), msg.GetBytes().data(), kByteData256Length,
        &keypair, &extra_params);
  }

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create Schnorr signature.");
  }

  return SchnorrSignature(raw_sig);
}